

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_if_stmt(SyntaxAnalyze *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RDI;
  LabelId ifEnd;
  RightVal right;
  string tmpName;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> condStr
  ;
  LabelId ifFalse;
  LabelId ifTrue;
  SharedExNdPtr cond;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  LabelId in_stack_fffffffffffffebc;
  irGenerator *in_stack_fffffffffffffec0;
  SyntaxAnalyze *in_stack_ffffffffffffff10;
  string local_88 [24];
  RightVal *in_stack_ffffffffffffff90;
  LeftVal *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  JumpKind in_stack_ffffffffffffffa4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  LabelId in_stack_ffffffffffffffb4;
  LabelId in_stack_ffffffffffffffb8;
  JumpInstructionKind in_stack_ffffffffffffffbc;
  SyntaxAnalyze *in_stack_ffffffffffffffc0;
  TyKind in_stack_ffffffffffffffd4;
  irGenerator *in_stack_ffffffffffffffd8;
  
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2acf99);
  irGenerator::irGenerator::getNewLabelId((irGenerator *)(in_RDI + 0x80));
  irGenerator::irGenerator::getNewLabelId((irGenerator *)(in_RDI + 0x80));
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x2acfe4);
  match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  gm_cond((SyntaxAnalyze *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe48);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ad03e);
  match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  peVar2 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ad05c);
  if (peVar2->_type == CNS) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x2ad091);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ad09e);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (int *)in_stack_fffffffffffffe48);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
              (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe48);
    irGenerator::irGenerator::ir_assign
              ((irGenerator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2ad116);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2ad123);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2ad147);
    std::__cxx11::string::~string(local_88);
  }
  else {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ad211);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffffe48);
  irGenerator::irGenerator::ir_jump
            ((irGenerator *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2ad298);
  irGenerator::irGenerator::ir_label(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  gm_stmt(in_stack_ffffffffffffff10);
  bVar1 = try_word((SyntaxAnalyze *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(Token)in_stack_fffffffffffffe58)
  ;
  if (bVar1) {
    irGenerator::irGenerator::getNewLabelId((irGenerator *)(in_RDI + 0x80));
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    irGenerator::irGenerator::ir_jump
              ((irGenerator *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa4);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2ad356);
    irGenerator::irGenerator::ir_label(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    gm_stmt(in_stack_ffffffffffffff10);
    irGenerator::irGenerator::ir_label(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  }
  else {
    irGenerator::irGenerator::ir_label(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2ad40c);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ad419);
  return;
}

Assistant:

void SyntaxAnalyze::gm_if_stmt() {
  SharedExNdPtr cond;
  LabelId ifTrue = irGenerator.getNewLabelId();
  LabelId ifFalse = irGenerator.getNewLabelId();
  std::optional<string> condStr;

  match_one_word(Token::IFTK);

  match_one_word(Token::LPARENT);

  cond = gm_cond();

  match_one_word(Token::RPARENT);

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, ifTrue, ifFalse,
                      condStr, mir::inst::JumpKind::Branch);
  irGenerator.ir_label(ifTrue);

  gm_stmt();

  if (try_word(1, Token::ELSETK)) {
    LabelId ifEnd = irGenerator.getNewLabelId();
    irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br, ifEnd, -1,
                        std::nullopt, mir::inst::JumpKind::Branch);
    irGenerator.ir_label(ifFalse);

    match_one_word(Token::ELSETK);
    gm_stmt();

    irGenerator.ir_label(ifEnd);
  } else {
    irGenerator.ir_label(ifFalse);
  }
}